

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O2

SmallVector<spvc_specialization_constant,_8UL> * __thiscall
spirv_cross::SmallVector<spvc_specialization_constant,_8UL>::operator=
          (SmallVector<spvc_specialization_constant,_8UL> *this,
          SmallVector<spvc_specialization_constant,_8UL> *other)

{
  spvc_specialization_constant *__ptr;
  ulong uVar1;
  size_t sVar2;
  size_t i;
  spvc_specialization_constant *psVar3;
  ulong uVar4;
  
  (this->super_VectorView<spvc_specialization_constant>).buffer_size = 0;
  psVar3 = (other->super_VectorView<spvc_specialization_constant>).ptr;
  if (psVar3 == (spvc_specialization_constant *)&other->stack_storage) {
    reserve(this,(other->super_VectorView<spvc_specialization_constant>).buffer_size);
    for (uVar4 = 0; uVar1 = (other->super_VectorView<spvc_specialization_constant>).buffer_size,
        uVar4 < uVar1; uVar4 = uVar4 + 1) {
      (this->super_VectorView<spvc_specialization_constant>).ptr[uVar4] =
           (other->super_VectorView<spvc_specialization_constant>).ptr[uVar4];
    }
    (this->super_VectorView<spvc_specialization_constant>).buffer_size = uVar1;
    (other->super_VectorView<spvc_specialization_constant>).buffer_size = 0;
  }
  else {
    __ptr = (this->super_VectorView<spvc_specialization_constant>).ptr;
    if (__ptr != (spvc_specialization_constant *)&this->stack_storage) {
      free(__ptr);
      psVar3 = (other->super_VectorView<spvc_specialization_constant>).ptr;
    }
    (this->super_VectorView<spvc_specialization_constant>).ptr = psVar3;
    sVar2 = other->buffer_capacity;
    (this->super_VectorView<spvc_specialization_constant>).buffer_size =
         (other->super_VectorView<spvc_specialization_constant>).buffer_size;
    this->buffer_capacity = sVar2;
    (other->super_VectorView<spvc_specialization_constant>).ptr =
         (spvc_specialization_constant *)0x0;
    (other->super_VectorView<spvc_specialization_constant>).buffer_size = 0;
    other->buffer_capacity = 0;
  }
  return this;
}

Assistant:

SmallVector &operator=(SmallVector &&other) SPIRV_CROSS_NOEXCEPT
	{
		clear();
		if (other.ptr != other.stack_storage.data())
		{
			// Pilfer allocated pointer.
			if (this->ptr != stack_storage.data())
				free(this->ptr);
			this->ptr = other.ptr;
			this->buffer_size = other.buffer_size;
			buffer_capacity = other.buffer_capacity;
			other.ptr = nullptr;
			other.buffer_size = 0;
			other.buffer_capacity = 0;
		}
		else
		{
			// Need to move the stack contents individually.
			reserve(other.buffer_size);
			for (size_t i = 0; i < other.buffer_size; i++)
			{
				new (&this->ptr[i]) T(std::move(other.ptr[i]));
				other.ptr[i].~T();
			}
			this->buffer_size = other.buffer_size;
			other.buffer_size = 0;
		}
		return *this;
	}